

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O0

void __thiscall
soul::SourceCodeUtilities::findASTObjectAt::FindLocationVisitor::FindLocationVisitor
          (FindLocationVisitor *this)

{
  FindLocationVisitor *this_local;
  
  ASTVisitor::ASTVisitor(&this->super_ASTVisitor);
  (this->super_ASTVisitor)._vptr_ASTVisitor = (_func_int **)&PTR__FindLocationVisitor_00584aa0;
  this->target = (char *)0x0;
  pool_ptr<soul::AST::ASTObject>::pool_ptr(&this->result);
  return;
}

Assistant:

void visitObject (AST::ASTObject& o) override
        {
            ASTVisitor::visitObject (o);

            auto distance = target - o.context.location.location.getAddress();

            if (distance == 0
                 || (distance > 0
                      && result != nullptr
                      && distance < target - result->context.location.location.getAddress()))
                result = o;
        }